

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

bool __thiscall
ON_BoundingBox::GetClosestPoint
          (ON_BoundingBox *this,ON_BoundingBox *other_box,ON_3dPoint *this_point,
          ON_3dPoint *other_point)

{
  ON_3dPoint *this_00;
  double dVar1;
  bool bVar2;
  double *pdVar3;
  int i;
  int i_00;
  ON_3dPoint *this_01;
  ON_BoundingBox *this_02;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  ON_Interval intersect;
  ON_Interval Io;
  ON_Interval It;
  ON_BoundingBox b;
  double local_d0;
  ON_Interval local_b8;
  ON_Interval local_a8;
  ON_Interval local_98;
  ON_Interval local_88;
  ON_Interval local_78;
  ON_BoundingBox local_60;
  
  ON_BoundingBox(&local_60);
  bVar2 = IsNotEmpty(this);
  if (bVar2) {
    bVar2 = IsNotEmpty(other_box);
    i_00 = 0;
    if (bVar2) {
      this_00 = &this->m_max;
      do {
        dVar8 = ON_3dPoint::operator[](&this->m_min,i_00);
        dVar1 = ON_3dPoint::operator[](this_00,i_00);
        ON_Interval::ON_Interval(&local_78,dVar8,dVar1);
        dVar8 = ON_3dPoint::operator[](&other_box->m_min,i_00);
        dVar1 = ON_3dPoint::operator[](&other_box->m_max,i_00);
        ON_Interval::ON_Interval(&local_88,dVar8,dVar1);
        ON_Interval::ON_Interval(&local_98);
        local_a8.m_t[0] = local_78.m_t[0];
        local_a8.m_t[1] = local_78.m_t[1];
        local_b8.m_t[0] = local_88.m_t[0];
        local_b8.m_t[1] = local_88.m_t[1];
        bVar2 = ON_Interval::IsDecreasing(&local_a8);
        if (bVar2) {
          ON_Interval::Swap(&local_a8);
        }
        bVar2 = ON_Interval::IsDecreasing(&local_b8);
        if (bVar2) {
          ON_Interval::Swap(&local_b8);
        }
        uVar5 = (undefined4)((ulong)local_a8.m_t[0] >> 0x20);
        uVar6 = (undefined4)((ulong)local_b8.m_t[0] >> 0x20);
        if ((((((local_a8.m_t[0] <= local_b8.m_t[0]) && (local_b8.m_t[0] <= local_a8.m_t[1])) &&
              (uVar4 = SUB84(local_b8.m_t[0],0), uVar7 = uVar6, dVar8 = local_a8.m_t[1],
              local_a8.m_t[1] <= local_b8.m_t[1])) ||
             (((dVar8 = local_b8.m_t[1], local_b8.m_t[0] <= local_a8.m_t[0] &&
               (local_a8.m_t[0] <= local_b8.m_t[1])) &&
              (uVar4 = SUB84(local_a8.m_t[0],0), uVar7 = uVar5, local_b8.m_t[1] <= local_a8.m_t[1]))
             )) || (((local_a8.m_t[0] <= local_b8.m_t[0] && (local_b8.m_t[0] <= local_b8.m_t[1])) &&
                    (uVar4 = SUB84(local_b8.m_t[0],0), uVar7 = uVar6,
                    local_b8.m_t[1] <= local_a8.m_t[1])))) ||
           (((local_b8.m_t[0] <= local_a8.m_t[0] && (local_a8.m_t[0] <= local_a8.m_t[1])) &&
            (uVar4 = SUB84(local_a8.m_t[0],0), uVar7 = uVar5, dVar8 = local_a8.m_t[1],
            local_a8.m_t[1] <= local_b8.m_t[1])))) {
          ON_Interval::Set(&local_98,(double)CONCAT44(uVar7,uVar4),dVar8);
LAB_003df301:
          local_d0 = ON_Interval::Mid(&local_98);
          pdVar3 = ON_3dPoint::operator[](other_point,i_00);
          *pdVar3 = local_d0;
          this_01 = this_point;
        }
        else {
          if ((local_b8.m_t[0] <= local_a8.m_t[1]) && (local_a8.m_t[0] <= local_b8.m_t[1]))
          goto LAB_003df301;
          local_98.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
          local_98.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
          dVar8 = ON_3dPoint::operator[](this_00,i_00);
          dVar1 = ON_3dPoint::operator[](&other_box->m_min,i_00);
          if (dVar1 <= dVar8) {
            dVar8 = ON_3dPoint::operator[](&this->m_min,i_00);
            pdVar3 = ON_3dPoint::operator[](this_point,i_00);
            *pdVar3 = dVar8;
            this_02 = (ON_BoundingBox *)&other_box->m_max;
          }
          else {
            dVar8 = ON_3dPoint::operator[](this_00,i_00);
            pdVar3 = ON_3dPoint::operator[](this_point,i_00);
            *pdVar3 = dVar8;
            this_02 = other_box;
          }
          local_d0 = ON_3dPoint::operator[](&this_02->m_min,i_00);
          this_01 = other_point;
        }
        pdVar3 = ON_3dPoint::operator[](this_01,i_00);
        *pdVar3 = local_d0;
        i_00 = i_00 + 1;
      } while (i_00 != 3);
      i_00 = 1;
    }
  }
  else {
    i_00 = 0;
  }
  return SUB41(i_00,0);
}

Assistant:

bool ON_BoundingBox::GetClosestPoint( 
       const ON_BoundingBox& other_box, // "other" bounding box
       ON_3dPoint& this_point, // point on "this" box that is closest to "other" box
       ON_3dPoint& other_point // point on "other" box that is closest to "this" box
       )  const
{
  ON_BoundingBox b;
	if ( !IsValid() || !other_box.IsValid() )
		return false;

	for (int i=0; i<3; i++ )
  {
		ON_Interval It(m_min[i],m_max[i]);
		ON_Interval Io(other_box.m_min[i],other_box.m_max[i]);
		ON_Interval intersect;
		bool NotEmpty = Intersect(It,Io,intersect);
		if(NotEmpty)
    {
			this_point[i] = other_point[i] = intersect.Mid();
		} 
    else {
			if(m_max[i]< other_box.m_min[i] )
      {
				this_point[i] = m_max[i];
				other_point[i] = other_box.m_min[i];
			} 
      else {
				this_point[i] = m_min[i];
				other_point[i] = other_box.m_max[i];
			}
		}
	}
	return true;
}